

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  BtShared **ppBVar1;
  char cVar2;
  PCache *pPVar3;
  sqlite3_file *psVar4;
  sqlite3_io_methods *psVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  Btree *p;
  BtShared *pBVar10;
  char *pcVar11;
  char *pcVar12;
  sqlite3_mutex *psVar13;
  Pager *pPVar14;
  ulong uVar15;
  sqlite3_mutex *psVar16;
  sqlite3_mutex *psVar17;
  void *pvVar18;
  uint uVar19;
  Btree **ppBVar20;
  code *pcVar21;
  Btree *pBVar22;
  u8 uVar23;
  long lVar24;
  Btree *pBVar25;
  Btree *pBVar26;
  Btree *pBVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  char *pcVar31;
  byte bVar32;
  u8 uVar33;
  u64 uVar34;
  byte bVar35;
  uint uVar36;
  bool bVar37;
  uchar zDbHeader [100];
  uint local_e4;
  char *local_d0;
  char *local_c8;
  uint local_a4;
  size_t local_a0;
  u32 local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if (zFilename == (char *)0x0) {
LAB_0011e597:
    bVar37 = true;
    if (db->temp_store != '\x02') goto LAB_0011e5af;
LAB_0011e5a1:
    local_e4 = flags | 2;
    bVar32 = 1;
  }
  else {
    cVar2 = *zFilename;
    bVar37 = cVar2 == '\0';
    iVar8 = strcmp(zFilename,":memory:");
    if (iVar8 == 0) goto LAB_0011e5a1;
    if (cVar2 == '\0') goto LAB_0011e597;
    bVar37 = false;
LAB_0011e5af:
    bVar32 = (byte)((vfsFlags & 0x80U) >> 7);
    local_e4 = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar9 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar32 == 0 && !bVar37) {
    uVar9 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar9 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  iVar8 = 7;
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->pPrev = (Btree *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  (p->lock).pNext = (BtLock *)0x0;
  p->nBackup = 0;
  p->iDataVersion = 0;
  p->pNext = (Btree *)0x0;
  p->pBt = (BtShared *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->field_0x13 = 0;
  p->wantToLock = 0;
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  if ((!bVar37) && ((uVar9 >> 0x11 & 1) != 0 && ((uVar9 & 0x40) == 0 & bVar32) == 0)) {
    if (zFilename == (char *)0x0) {
      uVar36 = 1;
    }
    else {
      uVar36 = 0xffffffff;
      pcVar11 = zFilename;
      do {
        uVar36 = uVar36 + 1;
        cVar2 = *pcVar11;
        pcVar11 = pcVar11 + 1;
      } while (cVar2 != '\0');
      uVar36 = (uVar36 & 0x3fffffff) + 1;
    }
    uVar28 = pVfs->mxPathname + 1;
    uVar19 = uVar36;
    if ((int)uVar36 < (int)uVar28) {
      uVar19 = uVar28;
    }
    pcVar11 = (char *)sqlite3Malloc((ulong)uVar19);
    p->sharable = '\x01';
    if (pcVar11 == (char *)0x0) {
LAB_0011e941:
      sqlite3_free(p);
      return iVar8;
    }
    if (bVar32 == 0) {
      *pcVar11 = '\0';
      iVar8 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar28,pcVar11);
      if (iVar8 != 0) {
        sqlite3_free(pcVar11);
        goto LAB_0011e941;
      }
    }
    else {
      memcpy(pcVar11,zFilename,(ulong)uVar36);
    }
    if (sqlite3Config.bCoreMutex == 0) {
      psVar16 = (sqlite3_mutex *)0x0;
      bVar6 = true;
      bVar37 = true;
      psVar13 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar13 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      bVar37 = psVar13 == (sqlite3_mutex *)0x0;
      if (!bVar37) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar13);
      }
      if ((sqlite3Config.bCoreMutex == 0) ||
         (psVar16 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar16 == (sqlite3_mutex *)0x0)) {
        psVar16 = (sqlite3_mutex *)0x0;
        bVar6 = true;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar16);
        bVar6 = false;
      }
    }
    pBVar10 = sqlite3SharedCacheList;
    if (sqlite3SharedCacheList != (BtShared *)0x0) {
LAB_0011ec7c:
      pPVar14 = pBVar10->pPager;
      iVar8 = strcmp(pcVar11,pPVar14->zFilename);
      if ((iVar8 != 0) || (pPVar14->pVfs != pVfs)) goto LAB_0011eca1;
      lVar24 = (long)db->nDb;
      if (0 < lVar24) {
        uVar15 = lVar24 + 1;
        ppBVar20 = &db->aDb[lVar24 + -1].pBt;
        do {
          if ((*ppBVar20 != (Btree *)0x0) && ((*ppBVar20)->pBt == pBVar10)) {
            if (!bVar6) {
              (*sqlite3Config.mutex.xMutexLeave)(psVar16);
            }
            if (!bVar37) {
              (*sqlite3Config.mutex.xMutexLeave)(psVar13);
            }
            sqlite3_free(pcVar11);
            sqlite3_free(p);
            return 0x13;
          }
          uVar15 = uVar15 - 1;
          ppBVar20 = ppBVar20 + -4;
        } while (1 < uVar15);
      }
      p->pBt = pBVar10;
      pBVar10->nRef = pBVar10->nRef + 1;
      bVar37 = false;
      goto LAB_0011ed83;
    }
    bVar37 = true;
    goto LAB_0011ed83;
  }
  psVar13 = (sqlite3_mutex *)0x0;
LAB_0011e652:
  pBVar10 = (BtShared *)sqlite3Malloc(0x88);
  if (pBVar10 == (BtShared *)0x0) {
    iVar8 = 7;
  }
  else {
    memset(pBVar10,0,0x88);
    local_98[0] = 0x400;
    uVar36 = 0x30;
    if (0x30 < pVfs->szOsFile) {
      uVar36 = pVfs->szOsFile + 7U & 0xfffffff8;
    }
    pBVar10->pPager = (Pager *)0x0;
    uVar19 = local_e4 & 2;
    local_c8 = zFilename;
    if (uVar19 == 0) {
      if (zFilename == (char *)0x0) {
        local_c8 = (char *)0x0;
        bVar37 = true;
LAB_0011e9dc:
        uVar23 = '\0';
        goto LAB_0011ea0b;
      }
      if (*zFilename == '\0') {
        bVar37 = false;
        goto LAB_0011e9dc;
      }
      iVar8 = pVfs->mxPathname;
      pcVar11 = (char *)sqlite3Malloc((long)iVar8 * 2 + 2);
      if (pcVar11 == (char *)0x0) {
LAB_0011e9ac:
        iVar8 = 7;
      }
      else {
        *pcVar11 = '\0';
        iVar8 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar8 + 1,pcVar11);
        lVar24 = 0;
        do {
          pcVar12 = pcVar11 + lVar24;
          lVar24 = lVar24 + 1;
        } while (*pcVar12 != '\0');
        lVar30 = -1;
        do {
          lVar7 = lVar30 + 1;
          lVar30 = lVar30 + 1;
        } while (zFilename[lVar7] != '\0');
        uVar28 = (uint)lVar30 & 0x3fffffff;
        local_d0 = zFilename + (ulong)uVar28 + 1;
        pcVar12 = local_d0;
        if (*local_d0 == '\0') {
          iVar29 = uVar28 + (int)zFilename;
        }
        else {
          do {
            lVar30 = 0;
            do {
              lVar7 = lVar30 + 1;
              lVar30 = lVar30 + 1;
            } while (pcVar12[lVar7] != '\0');
            uVar28 = (uint)lVar30 & 0x3fffffff;
            pcVar31 = pcVar12 + (ulong)uVar28 + 1;
            lVar30 = -1;
            do {
              lVar7 = lVar30 + (ulong)uVar28 + 2;
              lVar30 = lVar30 + 1;
            } while (pcVar12[lVar7] != '\0');
            uVar28 = (uint)lVar30 & 0x3fffffff;
            pcVar12 = pcVar31 + (ulong)uVar28 + 1;
          } while (pcVar31[(ulong)uVar28 + 1] != '\0');
          iVar29 = (int)pcVar31 + uVar28;
        }
        if (iVar8 == 0) {
          uVar28 = (int)lVar24 - 1U & 0x3fffffff;
          if ((int)(uVar28 + 8) <= pVfs->mxPathname) {
            iVar8 = (iVar29 - (int)local_d0) + 2;
            bVar37 = false;
            uVar23 = '\0';
            goto LAB_0011ea17;
          }
          iVar8 = 0xe;
          sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",0xb45b,
                      "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
        }
        sqlite3_free(pcVar11);
      }
    }
    else {
      if (zFilename == (char *)0x0) {
        uVar23 = '\x01';
        bVar37 = true;
        local_c8 = (char *)0x0;
LAB_0011ea0b:
        uVar28 = 0;
        pcVar11 = (char *)0x0;
        local_d0 = (char *)0x0;
        iVar8 = 0;
      }
      else {
        if (*zFilename == '\0') {
          uVar23 = '\x01';
          bVar37 = false;
          goto LAB_0011ea0b;
        }
        lVar24 = 0;
        do {
          lVar30 = lVar24 + 1;
          lVar24 = lVar24 + 1;
        } while (zFilename[lVar30] != '\0');
        uVar34 = (ulong)((uint)lVar24 & 0x3fffffff) + 1;
        pcVar11 = (char *)sqlite3Malloc(uVar34);
        if (pcVar11 == (char *)0x0) goto LAB_0011e9ac;
        memcpy(pcVar11,zFilename,uVar34);
        lVar24 = 0;
        do {
          pcVar12 = pcVar11 + lVar24;
          lVar24 = lVar24 + 1;
        } while (*pcVar12 != '\0');
        uVar28 = (int)lVar24 - 1U & 0x3fffffff;
        local_c8 = (char *)0x0;
        bVar37 = true;
        uVar23 = '\x01';
        local_d0 = (char *)0x0;
        iVar8 = 0;
      }
LAB_0011ea17:
      uVar15 = (ulong)uVar28;
      local_a0 = (size_t)iVar8;
      uVar34 = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) +
               (long)(int)(uVar36 * 2) + local_a0 + uVar15 * 3 + 0x189;
      pPVar14 = (Pager *)sqlite3Malloc(uVar34);
      if (pPVar14 == (Pager *)0x0) {
        iVar8 = 7;
        if (pcVar11 != (char *)0x0) {
          sqlite3_free(pcVar11);
        }
      }
      else {
        memset(pPVar14,0,uVar34);
        pPVar14->pPCache = (PCache *)(pPVar14 + 1);
        pPVar14->fd = (sqlite3_file *)&pPVar14[1].jfd;
        pcVar12 = pPVar14[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x38);
        pPVar14->sjfd = (sqlite3_file *)pcVar12;
        pPVar14->jfd = (sqlite3_file *)(pcVar12 + (int)uVar36);
        pcVar12 = pcVar12 + (int)uVar36 + (int)uVar36;
        pPVar14->zFilename = pcVar12;
        if (pcVar11 != (char *)0x0) {
          pPVar14->zJournal = pcVar12 + (int)(uVar28 + iVar8 + 1);
          memcpy(pcVar12,pcVar11,uVar15);
          if (iVar8 != 0) {
            memcpy(pPVar14->zFilename + (uVar28 + 1),local_d0,local_a0);
          }
          memcpy(pPVar14->zJournal,pcVar11,uVar15);
          builtin_strncpy(pPVar14->zJournal + uVar15,"-journal",9);
          (pPVar14->zJournal + uVar15 + 8)[1] = '\0';
          pPVar14->zWal = pPVar14->zJournal + uVar15 + 9;
          memcpy(pPVar14->zJournal + uVar15 + 9,pcVar11,uVar15);
          builtin_strncpy(pPVar14->zWal + uVar15,"-wal",5);
          sqlite3_free(pcVar11);
        }
        pPVar14->pVfs = pVfs;
        pPVar14->vfsFlags = uVar9;
        if ((bVar37) || (*local_c8 == '\0')) {
LAB_0011eef2:
          pPVar14->eState = '\x01';
          pPVar14->eLock = '\x04';
          pPVar14->noLock = '\x01';
          bVar35 = (byte)uVar9 & 1;
          uVar33 = '\x01';
          bVar37 = false;
LAB_0011ef09:
          iVar8 = sqlite3PagerSetPagesize(pPVar14,local_98,-1);
          if (iVar8 == 0) {
            pcVar21 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            if (uVar19 == 0) {
              pcVar21 = pagerStress;
            }
            pPVar3 = pPVar14->pPCache;
            pPVar3->szPage = 0;
            pPVar3->szExtra = 0;
            pPVar3->bPurgeable = '\0';
            pPVar3->eCreate = '\0';
            *(undefined6 *)&pPVar3->field_0x2a = 0;
            pPVar3->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            pPVar3->pStress = (void *)0x0;
            pPVar3->pSynced = (PgHdr *)0x0;
            pPVar3->nRef = 0;
            pPVar3->szCache = 0;
            pPVar3->pCache = (sqlite3_pcache *)0x0;
            pPVar3->pPage1 = (PgHdr *)0x0;
            pPVar3->pDirty = (PgHdr *)0x0;
            pPVar3->pDirtyTail = (PgHdr *)0x0;
            pPVar3->szPage = 1;
            pPVar3->szExtra = 0x78;
            pPVar3->bPurgeable = (byte)(uVar19 >> 1) ^ 1;
            pPVar3->eCreate = '\x02';
            pPVar3->xStress = pcVar21;
            pPVar3->pStress = pPVar14;
            pPVar3->szCache = 100;
            iVar8 = sqlite3PcacheSetPageSize(pPVar3,local_98[0]);
            if (iVar8 == 0) {
              pPVar14->useJournal = (byte)(local_e4 & 1) ^ 1;
              pPVar14->mxPgno = 0x3fffffff;
              pPVar14->tempFile = uVar33;
              pPVar14->exclusiveMode = uVar33;
              pPVar14->changeCountDone = uVar33;
              pPVar14->memDb = uVar23;
              pPVar14->readOnly = bVar35;
              pPVar14->noSync = uVar33;
              if (bVar37) {
                pPVar14->fullSync = '\x01';
                pPVar14->ckptSyncFlags = '\x02';
                pPVar14->walSyncFlags = '\"';
                pPVar14->syncFlags = '\x02';
              }
              pPVar14->nExtra = 0x78;
              pPVar14->journalSizeLimit = -1;
              setSectorSize(pPVar14);
              if ((local_e4 & 3) != 0) {
                pPVar14->journalMode = ((local_e4 & 1) == 0) * '\x02' + '\x02';
              }
              pPVar14->xReiniter = pageReinit;
              pBVar10->pPager = pPVar14;
              pPVar14->szMmap = db->szMmap;
              pagerFixMaplimit(pPVar14);
              local_48 = 0;
              uStack_40 = 0;
              local_58 = 0;
              uStack_50 = 0;
              local_68 = 0;
              uStack_60 = 0;
              local_78 = 0;
              uStack_70 = 0;
              local_88 = 0;
              uStack_80 = 0;
              local_98[0] = 0;
              local_98[1] = 0;
              local_98[2] = 0;
              local_98[3] = 0;
              local_38 = 0;
              psVar4 = pBVar10->pPager->fd;
              psVar5 = psVar4->pMethods;
              if (((psVar5 == (sqlite3_io_methods *)0x0) ||
                  (iVar8 = (*psVar5->xRead)(psVar4,local_98,100,0), iVar8 == 0x20a)) || (iVar8 == 0)
                 ) {
                pBVar10->openFlags = (u8)local_e4;
                pBVar10->db = db;
                pPVar14 = pBVar10->pPager;
                pPVar14->xBusyHandler = btreeInvokeBusyHandler;
                pPVar14->pBusyHandlerArg = pBVar10;
                psVar5 = pPVar14->fd->pMethods;
                if (psVar5 != (sqlite3_io_methods *)0x0) {
                  (*psVar5->xFileControl)(pPVar14->fd,0xf,&pPVar14->xBusyHandler);
                  pPVar14 = pBVar10->pPager;
                }
                p->pBt = pBVar10;
                pBVar10->pCursor = (BtCursor *)0x0;
                pBVar10->pPage1 = (MemPage *)0x0;
                if (pPVar14->readOnly != '\0') {
                  *(byte *)&pBVar10->btsFlags = (byte)pBVar10->btsFlags | 1;
                }
                iVar8 = (int)((local_88 & 0xff) << 8);
                uVar9 = (uint)local_88._1_1_ * 0x10000 + iVar8;
                pBVar10->pageSize = uVar9;
                if (((iVar8 + (uint)local_88._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
                   ((uVar9 + 0x1ffff & uVar9) != 0)) {
                  pBVar10->pageSize = 0;
                  uVar9 = 0;
                  if (zFilename != (char *)0x0 && bVar32 == 0) {
                    pBVar10->autoVacuum = '\0';
                    pBVar10->incrVacuum = '\0';
                  }
                }
                else {
                  uVar9 = (uint)local_88._4_1_;
                  pBVar10->btsFlags = pBVar10->btsFlags | 2;
                  pBVar10->autoVacuum =
                       ((local_68._4_4_ >> 0x18 != 0 || (local_68 & 0xff000000000000) != 0) ||
                       (local_68 & 0xff0000000000) != 0) || (local_68 & 0xff00000000) != 0;
                  pBVar10->incrVacuum =
                       (((uint)local_58 >> 0x18 != 0 || (local_58 & 0xff0000) != 0) ||
                       (local_58 & 0xff00) != 0) || (local_58 & 0xff) != 0;
                }
                iVar8 = sqlite3PagerSetPagesize(pPVar14,&pBVar10->pageSize,uVar9);
                if (iVar8 == 0) {
                  pBVar10->usableSize = pBVar10->pageSize - uVar9;
                  if (p->sharable == '\0') goto LAB_0011edab;
                  pBVar10->nRef = 1;
                  if (sqlite3Config.bCoreMutex != 0) {
                    psVar16 = (*sqlite3Config.mutex.xMutexAlloc)(2);
                    if (sqlite3Config.bCoreMutex != 0) {
                      psVar17 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                      pBVar10->mutex = psVar17;
                      if (psVar17 == (sqlite3_mutex *)0x0) {
                        db->mallocFailed = '\0';
                        iVar8 = 7;
                        goto LAB_0011efd5;
                      }
                    }
                    if (psVar16 != (sqlite3_mutex *)0x0) {
                      (*sqlite3Config.mutex.xMutexEnter)(psVar16);
                      pBVar10->pNext = sqlite3SharedCacheList;
                      sqlite3SharedCacheList = pBVar10;
                      (*sqlite3Config.mutex.xMutexLeave)(psVar16);
                      goto LAB_0011edab;
                    }
                  }
                  pBVar10->pNext = sqlite3SharedCacheList;
                  sqlite3SharedCacheList = pBVar10;
                  goto LAB_0011edab;
                }
              }
              goto LAB_0011efd5;
            }
          }
        }
        else {
          local_a4 = 0;
          iVar8 = (*pVfs->xOpen)(pVfs,pPVar14->zFilename,pPVar14->fd,uVar9 & 0x87f7f,
                                 (int *)&local_a4);
          if (iVar8 == 0) {
            uVar36 = local_a4 & 1;
            bVar35 = (byte)uVar36;
            uVar9 = (*pPVar14->fd->pMethods->xDeviceCharacteristics)(pPVar14->fd);
            if (uVar36 == 0) {
              setSectorSize(pPVar14);
              uVar36 = pPVar14->sectorSize;
              if (0x400 < uVar36) {
                if (uVar36 < 0x2001) {
                  local_98[0] = uVar36;
                }
                else {
                  local_98[0] = 0x2000;
                }
              }
            }
            iVar8 = sqlite3_uri_boolean(local_c8,"nolock",0);
            pPVar14->noLock = (u8)iVar8;
            if (((uVar9 >> 0xd & 1) != 0) ||
               (iVar8 = sqlite3_uri_boolean(local_c8,"immutable",0), iVar8 != 0)) {
              uVar9 = 1;
              goto LAB_0011eef2;
            }
            bVar37 = true;
            uVar33 = '\0';
            goto LAB_0011ef09;
          }
        }
        psVar4 = pPVar14->fd;
        if (psVar4->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar4->pMethods->xClose)(psVar4);
          psVar4->pMethods = (sqlite3_io_methods *)0x0;
        }
        pcache1Free(pPVar14->pTmpSpace);
        sqlite3_free(pPVar14);
      }
    }
LAB_0011efd5:
    if (pBVar10->pPager != (Pager *)0x0) {
      sqlite3PagerClose(pBVar10->pPager);
    }
  }
  sqlite3_free(pBVar10);
  sqlite3_free(p);
  *ppBtree = (Btree *)0x0;
  goto LAB_0011effa;
LAB_0011eca1:
  ppBVar1 = &pBVar10->pNext;
  pBVar10 = *ppBVar1;
  if (*ppBVar1 == (BtShared *)0x0) goto code_r0x0011ecaa;
  goto LAB_0011ec7c;
code_r0x0011ecaa:
  bVar37 = true;
LAB_0011ed83:
  if (!bVar6) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar16);
  }
  sqlite3_free(pcVar11);
  if (bVar37) goto LAB_0011e652;
LAB_0011edab:
  if ((p->sharable != '\0') && (0 < (long)db->nDb)) {
    lVar24 = 0;
    do {
      pBVar27 = *(Btree **)((long)&db->aDb->pBt + lVar24);
      if ((pBVar27 != (Btree *)0x0) && (pBVar27->sharable != '\0')) goto LAB_0011edec;
      lVar24 = lVar24 + 0x20;
    } while ((long)db->nDb * 0x20 != lVar24);
  }
  goto LAB_0011f305;
LAB_0011edec:
  do {
    pBVar25 = pBVar27;
    pBVar27 = pBVar25->pPrev;
  } while (pBVar25->pPrev != (Btree *)0x0);
  lVar24 = 0x20;
  if (p->pBt < pBVar25->pBt) {
    ppBVar20 = &pBVar25->pPrev;
    pBVar22 = (Btree *)0x0;
    pBVar27 = p;
  }
  else {
    do {
      pBVar26 = pBVar25;
      pBVar27 = pBVar26->pNext;
      if (pBVar27 == (Btree *)0x0) {
        ppBVar20 = &pBVar26->pNext;
        pBVar25 = (Btree *)0x0;
        pBVar22 = pBVar26;
        pBVar27 = p;
        goto LAB_0011f2fa;
      }
      pBVar25 = pBVar27;
    } while (pBVar27->pBt < p->pBt);
    ppBVar20 = &pBVar26->pNext;
    p->pNext = pBVar27;
    lVar24 = 0x28;
    pBVar22 = p;
    pBVar25 = pBVar26;
  }
LAB_0011f2fa:
  *(Btree **)((long)&p->db + lVar24) = pBVar25;
  pBVar27->pPrev = pBVar22;
  *ppBVar20 = p;
LAB_0011f305:
  *ppBtree = p;
  iVar8 = 0;
  pvVar18 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar18 == (void *)0x0) {
    pPVar3 = p->pBt->pPager->pPCache;
    pPVar3->szCache = 2000;
    (*sqlite3Config.pcache2.xCachesize)(pPVar3->pCache,2000);
  }
LAB_0011effa:
  if (psVar13 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar13);
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          EXTRA_SIZE, flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#ifdef SQLITE_SECURE_DELETE
    pBt->btsFlags |= BTS_SECURE_DELETE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      pBt->nRef = 1;
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM;
          db->mallocFailed = 0;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( p->pBt<pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && pSib->pNext->pBt<p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  return rc;
}